

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O1

bool dg::pta::PointerAnalysisFSInv::overwriteMOFromFree(MemoryMapT *mm,PSNode *target)

{
  PointsToMapT *this;
  _Hash_node_base *p_Var1;
  bool bVar2;
  STLHashMap<unsigned_long,_unsigned_long> *__range3;
  MemoryObject *pMVar3;
  mapped_type *pmVar4;
  _Rb_tree_header *p_Var5;
  byte bVar6;
  long lVar7;
  _Hash_node_base *p_Var8;
  long lVar9;
  _Hash_node_base *p_Var10;
  key_type local_30;
  Pointer local_28;
  
  pMVar3 = getOrCreateMO(mm,target);
  this = &pMVar3->pointsTo;
  if ((pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    local_28.target = (PSNode *)0x0;
    pmVar4 = std::
             map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
             ::operator[](this,(key_type *)&local_28);
    p_Var1 = (pmVar4->pointers)._bits.
             super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
             .
             super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ._M_h._M_before_begin._M_nxt;
    if (p_Var1 != (_Hash_node_base *)0x0) {
      lVar7 = 0;
      p_Var8 = p_Var1;
      do {
        p_Var10 = p_Var8[2]._M_nxt;
        lVar9 = 0;
        if (p_Var10 != (_Hash_node_base *)0x0) {
          do {
            lVar9 = lVar9 + (ulong)((uint)p_Var10 & 1);
            bVar2 = (_Hash_node_base *)0x1 < p_Var10;
            p_Var10 = (_Hash_node_base *)((ulong)p_Var10 >> 1);
          } while (bVar2);
        }
        lVar7 = lVar7 + lVar9;
        p_Var8 = p_Var8->_M_nxt;
      } while (p_Var8 != (_Hash_node_base *)0x0);
      if (lVar7 == 1) {
        if (((pmVar4->pointers)._bits.
             super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
             .
             super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ._M_h._M_element_count == 0) || (((ulong)p_Var1[2]._M_nxt & 1) != 0)) {
          lVar7 = 0;
        }
        else {
          lVar7 = 0;
          do {
            if (lVar7 == 0x3f) {
              lVar7 = 0x40;
              break;
            }
            bVar6 = (byte)lVar7;
            lVar7 = lVar7 + 1;
          } while (((ulong)p_Var1[2]._M_nxt >> (bVar6 & 0x3f) & 2) == 0);
        }
        if (*(PSNode **)((long)p_Var1[1]._M_nxt * 0x10 + -0x10 + lVar7 * 0x10 + __M_assign) ==
            INVALIDATED) {
          return false;
        }
      }
    }
  }
  std::
  _Rb_tree<dg::Offset,_std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>,_std::_Select1st<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
  ::_M_erase(&this->_M_t,
             (_Link_type)(pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var5 = &(pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header;
  (pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  (pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  (pMVar3->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_30.offset = 0;
  pmVar4 = std::
           map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
           ::operator[](this,&local_30);
  local_28.target = INVALIDATED;
  local_28.offset.offset = 0;
  PointerIdPointsToSet::add(pmVar4,&local_28);
  return true;
}

Assistant:

static bool overwriteMOFromFree(MemoryMapT *mm, PSNode *target) {
        // if we know exactly which memory object
        // is being used for freeing the memory,
        // we can set it to invalidated
        auto *mo = getOrCreateMO(mm, target);
        if (mo->pointsTo.size() == 1) {
            auto &S = mo->pointsTo[0];
            if (S.size() == 1 && (*S.begin()).target == INVALIDATED) {
                return false; // no update
            }
        }

        mo->pointsTo.clear();
        mo->pointsTo[0].add(INVALIDATED, 0);
        return true;
    }